

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Input::kf_copy_cut(Fl_Input *this)

{
  int iVar1;
  EVP_PKEY_CTX *in_RDX;
  
  if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) == 0) {
    Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)0x1,in_RDX);
    iVar1 = Fl_Input_::cut(&this->super_Fl_Input_);
    return iVar1;
  }
  fl_beep(0);
  return 1;
}

Assistant:

int Fl_Input::kf_copy_cut() {
  if (readonly()) { fl_beep(); return 1; }
  copy(1);
  return cut();
}